

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O1

void anon_unknown.dwarf_ccca1c::checkForInvalidNestedConfigNodes
               (ASTContext *context,InstanceOverride *node,ConfigBlockSymbol *configBlock)

{
  char_pointer puVar1;
  ConfigRule *pCVar2;
  uint uVar3;
  Diagnostic *this;
  char_pointer puVar4;
  uint uVar5;
  char_pointer puVar7;
  undefined1 auVar8 [16];
  SourceRange sourceRange;
  iterator iVar9;
  table_element_pointer ppVar6;
  
  pCVar2 = node->rule;
  if (pCVar2 != (ConfigRule *)0x0) {
    pCVar2->isUsed = true;
    sourceRange = slang::syntax::SyntaxNode::sourceRange((pCVar2->syntax).ptr);
    this = slang::ast::ASTContext::addDiag(context,(DiagCode)0x1a0006,sourceRange);
    if (configBlock->resolved == false) {
      slang::ast::ConfigBlockSymbol::resolve(configBlock);
    }
    slang::Diagnostic::addNote(this,(DiagCode)0x40001,((configBlock->topCells)._M_ptr)->sourceRange)
    ;
  }
  iVar9 = boost::unordered::detail::foa::
          table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
          ::begin((table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                   *)node);
  ppVar6 = iVar9.p_;
joined_r0x002cd7f5:
  if (ppVar6 == (table_element_pointer)0x0) {
    return;
  }
  checkForInvalidNestedConfigNodes(context,&(iVar9.p_)->second,configBlock);
  puVar4 = iVar9.pc_ + 2;
  do {
    puVar7 = puVar4;
    puVar4 = iVar9.pc_;
    ppVar6 = iVar9.p_ + 1;
    if (((uint)iVar9.pc_ & 0xf) == 0xe) goto LAB_002cd84f;
    puVar1 = puVar7 + -1;
    iVar9.p_ = ppVar6;
    iVar9.pc_ = puVar4 + 1;
    puVar4 = puVar7 + 1;
  } while (*puVar1 == '\0');
  puVar7 = puVar7 + -1;
  if (*puVar1 == '\x01') {
    ppVar6 = (table_element_pointer)0x0;
  }
  goto LAB_002cd843;
LAB_002cd84f:
  do {
    auVar8[0] = -(*puVar7 == '\0');
    auVar8[1] = -(puVar7[1] == '\0');
    auVar8[2] = -(puVar7[2] == '\0');
    auVar8[3] = -(puVar7[3] == '\0');
    auVar8[4] = -(puVar7[4] == '\0');
    auVar8[5] = -(puVar7[5] == '\0');
    auVar8[6] = -(puVar7[6] == '\0');
    auVar8[7] = -(puVar7[7] == '\0');
    auVar8[8] = -(puVar7[8] == '\0');
    auVar8[9] = -(puVar7[9] == '\0');
    auVar8[10] = -(puVar7[10] == '\0');
    auVar8[0xb] = -(puVar7[0xb] == '\0');
    auVar8[0xc] = -(puVar7[0xc] == '\0');
    auVar8[0xd] = -(puVar7[0xd] == '\0');
    auVar8[0xe] = -(puVar7[0xe] == '\0');
    auVar8[0xf] = -(puVar7[0xf] == '\0');
    uVar5 = (uint)(ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe);
    if (uVar5 == 0x7fff) {
      puVar7 = puVar7 + 0x10;
      ppVar6 = ppVar6 + 0xf;
    }
    else {
      uVar3 = 0;
      if ((uVar5 ^ 0x7fff) != 0) {
        for (; ((uVar5 ^ 0x7fff) >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
        }
      }
      if (puVar7[uVar3] == '\x01') {
        ppVar6 = (table_element_pointer)0x0;
      }
      else {
        puVar7 = puVar7 + uVar3;
        ppVar6 = ppVar6 + uVar3;
      }
    }
  } while (uVar5 == 0x7fff);
LAB_002cd843:
  iVar9.p_ = ppVar6;
  iVar9.pc_ = puVar7;
  goto joined_r0x002cd7f5;
}

Assistant:

void checkForInvalidNestedConfigNodes(const ASTContext& context,
                                      const ConfigBlockSymbol::InstanceOverride& node,
                                      const ConfigBlockSymbol& configBlock) {
    if (node.rule) {
        // Mark the rule as used so we don't also get a warning
        // about this rule when we're going to give a hard error anyway.
        node.rule->isUsed = true;

        auto& diag = context.addDiag(diag::ConfigInstanceUnderOtherConfig,
                                     node.rule->syntax->sourceRange());
        diag.addNote(diag::NoteConfigRule, configBlock.getTopCells()[0].sourceRange);
    }

    for (auto& [_, child] : node.childNodes)
        checkForInvalidNestedConfigNodes(context, child, configBlock);
}